

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uenum.cpp
# Opt level: O1

UChar * uenum_unextDefault_63(UEnumeration *en,int32_t *resultLength,UErrorCode *status)

{
  uint in_EAX;
  char *cs;
  UChar *us;
  int32_t len;
  undefined8 uStack_28;
  
  uStack_28 = (ulong)in_EAX;
  if (en->next == (UEnumNext *)0x0) {
    *status = U_UNSUPPORTED_ERROR;
  }
  else {
    cs = (*en->next)(en,(int32_t *)((long)&uStack_28 + 4),status);
    if (cs != (char *)0x0) {
      us = (UChar *)_getBuffer(en,uStack_28._4_4_ * 2 + 2);
      if (us != (UChar *)0x0) {
        u_charsToUChars_63(cs,us,uStack_28._4_4_ + 1);
        goto LAB_00353d21;
      }
      *status = U_MEMORY_ALLOCATION_ERROR;
    }
  }
  us = (UChar *)0x0;
LAB_00353d21:
  if (resultLength != (int32_t *)0x0) {
    *resultLength = uStack_28._4_4_;
  }
  return us;
}

Assistant:

U_CAPI const UChar* U_EXPORT2
uenum_unextDefault(UEnumeration* en,
            int32_t* resultLength,
            UErrorCode* status)
{
    UChar *ustr = NULL;
    int32_t len = 0;
    if (en->next != NULL) {
        const char *cstr = en->next(en, &len, status);
        if (cstr != NULL) {
            ustr = (UChar*) _getBuffer(en, (len+1) * sizeof(UChar));
            if (ustr == NULL) {
                *status = U_MEMORY_ALLOCATION_ERROR;
            } else {
                u_charsToUChars(cstr, ustr, len+1);
            }
        }
    } else {
        *status = U_UNSUPPORTED_ERROR;
    }
    if (resultLength) {
        *resultLength = len;
    }
    return ustr;
}